

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O1

Result * CoreML::validateModelLevelFeatureDescriptionsAreEmpty
                   (Result *__return_storage_ptr__,ModelDescription *interface)

{
  string local_30;
  
  if ((interface->input_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    if ((interface->output_).super_RepeatedPtrFieldBase.current_size_ == 0) {
      if ((interface->state_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        if (*(long *)(((ulong)(interface->predictedfeaturename_).tagged_ptr_.ptr_ &
                      0xfffffffffffffffe) + 8) == 0) {
          if (*(long *)(((ulong)(interface->predictedprobabilitiesname_).tagged_ptr_.ptr_ &
                        0xfffffffffffffffe) + 8) == 0) {
            if ((interface->traininginput_).super_RepeatedPtrFieldBase.current_size_ == 0) {
              Result::Result(__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_30,
                       "Multi-function model must not use top level training input feature description."
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
          }
          else {
            local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_30,
                       "Multi-function model must not use top level predictedProbabilitiesName field."
                       ,"");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
          }
        }
        else {
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_30,
                     "Multi-function model must not use top level predictedFeatureName field.","");
          Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
        }
      }
      else {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_30,
                   "Multi-function model must not use top level state feature description.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
      }
    }
    else {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,
                 "Multi-function model must not use top level output feature description.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
    }
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "Multi-function model must not use top level input feature description.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateModelLevelFeatureDescriptionsAreEmpty(const Specification::ModelDescription& interface) {
        if (interface.input_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level input feature description.");
        }

        if (interface.output_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level output feature description.");
        }

        if (interface.state_size() != 0) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level state feature description.");
        }

        if (!interface.predictedfeaturename().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level predictedFeatureName field.");
        }

        if (!interface.predictedprobabilitiesname().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level predictedProbabilitiesName field.");
        }

        if (!interface.traininginput().empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE, "Multi-function model must not use top level training input feature description.");
        }

        return Result();
    }